

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void rsvd(double *A,int M,int N,int K,int oversample,int n_iter,double *U,double *V,double *S)

{
  int N_00;
  time_t tVar1;
  double *A_00;
  double *C;
  double *col;
  int *ipiv_00;
  double *R_00;
  double *bvec_00;
  double *U_00;
  double *V_00;
  double *q;
  int local_84;
  int *ipiv;
  double *sq;
  double *vq;
  double *uq;
  double *bvec;
  double *R;
  double *AT;
  double *Q2;
  double *Q1;
  int L;
  int maxdim;
  int j;
  int i;
  int n_iter_local;
  int oversample_local;
  int K_local;
  int N_local;
  int M_local;
  double *A_local;
  
  if (n_iter == 0) {
    printf(
          "Number of power iterations must be >= 1 or set it to < 0 if you want to use default value #RSVD_POWER_ITERATIONS \n"
          );
    exit(-1);
  }
  j = n_iter;
  if (n_iter < 0) {
    j = 5;
  }
  N_00 = K + oversample;
  local_84 = N;
  if (N < M) {
    local_84 = M;
  }
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  if (M < N) {
    printf("Randomized SVD is only implemented for tall matrices (rows > columns)");
    exit(-1);
  }
  A_00 = (double *)malloc((long)local_84 * 8 * (long)N_00);
  C = (double *)malloc((long)local_84 * 8 * (long)N_00);
  col = (double *)malloc((long)M * 8 * (long)N);
  ipiv_00 = (int *)malloc((long)local_84 << 2);
  R_00 = (double *)malloc((long)N_00 * 8 * (long)N_00);
  bvec_00 = (double *)malloc((long)N_00 * 8 * (long)N_00);
  U_00 = (double *)malloc((long)N_00 * 8 * (long)N_00);
  V_00 = (double *)malloc((long)N_00 * 8 * (long)N);
  q = (double *)malloc((long)N_00 << 3);
  random_matrix(A_00,N,N_00);
  mtranspose(A,M,N,col);
  for (maxdim = 0; maxdim < j; maxdim = maxdim + 1) {
    mmult(A,A_00,C,M,N,N_00);
    rludecomp(C,M,N_00,ipiv_00);
    getPU(C,M,N_00,ipiv_00,A_00,(double *)0x0);
    mmult(col,A_00,C,N,M,N_00);
    rludecomp(C,N,N_00,ipiv_00);
    getPU(C,N,N_00,ipiv_00,A_00,(double *)0x0);
  }
  mmult(A,A_00,C,M,N,N_00);
  qrdecomp(C,M,N_00,bvec_00);
  getQR(C,M,N_00,bvec_00,A_00,R_00);
  mtranspose(A_00,M,N_00,C);
  mmult(C,A,A_00,N_00,M,N);
  svd_transpose(A_00,N_00,N,U_00,V_00,q);
  for (maxdim = 0; maxdim < N; maxdim = maxdim + 1) {
    for (L = 0; L < K; L = L + 1) {
      V[maxdim * K + L] = V_00[maxdim * N_00 + L];
    }
  }
  memcpy(S,q,(long)K << 3);
  itranspose(C,N_00,M);
  mmult(C,U_00,A_00,M,N_00,N_00);
  for (maxdim = 0; maxdim < M; maxdim = maxdim + 1) {
    for (L = 0; L < K; L = L + 1) {
      U[maxdim * K + L] = A_00[maxdim * N_00 + L];
    }
  }
  free(A_00);
  free(C);
  free(ipiv_00);
  free(col);
  free(R_00);
  free(bvec_00);
  free(U_00);
  free(V_00);
  free(q);
  return;
}

Assistant:

void rsvd(double *A, int M, int N,int K, int oversample, int n_iter,double *U, double *V, double *S) {
	/*
	A - MXN matrix
	K - Rank of approximation being constructed. K <= min(m,n). default value 6
	L - block size of the normalized power iterations. Default K+2
	n_iter - number of normalized power iterations to conduct. Default 2
	U - MXK
	V - NXK
	S - Diagonal Matrix KXK
	*/

	if (n_iter == 0) {
		printf("Number of power iterations must be >= 1 or set it to < 0 if you want to use default value #RSVD_POWER_ITERATIONS \n");
		exit(-1);
	}
	else if (n_iter < 0) {
		n_iter = (int)RSVD_POWER_ITERATIONS;
	}

	int i, j,maxdim,L;
	double *Q1,*Q2,*AT,*R,*bvec,*uq,*vq,*sq;
	int *ipiv;

	L = K + oversample;

	maxdim = M > N ? M : N;
	srand(time(NULL));

	if (M >= N) {

		Q1 = (double*)malloc(sizeof(double)*maxdim*L);
		Q2 = (double*)malloc(sizeof(double)*maxdim*L);
		AT = (double*)malloc(sizeof(double)*M*N);
		ipiv = (int*)malloc(sizeof(int)*maxdim);
		R = (double*)malloc(sizeof(double)*L*L);
		bvec = (double*)malloc(sizeof(double)*L*L);

		uq = (double*)malloc(sizeof(double)*L*L);
		vq = (double*)malloc(sizeof(double)*L*N);
		sq = (double*)malloc(sizeof(double)*L);

		random_matrix(Q1, N, L);// N*L
		
		mtranspose(A, M, N, AT);

		for (i = 0; i < n_iter; ++i) {
			mmult(A, Q1, Q2, M, N, L);// M*L
			rludecomp(Q2, M, L, ipiv);
			getPU(Q2, M, L, ipiv, Q1, NULL);// M*L
			mmult(AT, Q1, Q2, N, M, L);//N*L
			rludecomp(Q2, N, L, ipiv);
			getPU(Q2, N, L, ipiv, Q1, NULL);// N*L
		}

		mmult(A, Q1, Q2, M, N, L);
		qrdecomp(Q2, M, L, bvec);
		getQR(Q2, M, L, bvec, Q1, R);// M*L

		mtranspose(Q1, M, L, Q2);// L*M
		mmult(Q2, A, Q1, L, M, N);// L* N

		svd_transpose(Q1, L, N, uq, vq, sq);
		// uq - LXL
		// vq - NXL
		//itranspose(vq, N, L);

		for (i = 0; i < N; ++i) {
			for (j = 0; j < K; ++j) {
				V[i*K + j] = vq[i*L + j];
			}
		}

		memcpy(S, sq, sizeof(double)*K);
		
		itranspose(Q2, L, M);

		mmult(Q2, uq, Q1, M, L, L);

		for (i = 0; i < M; ++i) {
			for (j = 0; j < K; ++j) {
				U[i*K + j] = Q1[i*L + j];
			}
		}

		free(Q1);
		free(Q2);
		free(ipiv);
		free(AT);
		free(R);
		free(bvec);
		free(uq);
		free(vq);
		free(sq);

	}
	else {
		printf("Randomized SVD is only implemented for tall matrices (rows > columns)");
		exit(-1);
	}

}